

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_uqadd_s32_aarch64(CPUARMState_conflict *env,uint32_t a,uint32_t b)

{
  long local_30;
  int64_t vr;
  int64_t vb;
  int64_t va;
  uint32_t b_local;
  uint32_t a_local;
  CPUARMState_conflict *env_local;
  
  local_30 = (long)(int)a + (ulong)b;
  if (local_30 < 0x100000000) {
    if (local_30 < 0) {
      (env->vfp).qc[0] = 1;
      local_30 = 0;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    local_30._0_4_ = 0xffffffff;
  }
  return (uint32_t)local_30;
}

Assistant:

uint32_t HELPER(neon_uqadd_s32)(CPUARMState *env, uint32_t a, uint32_t b)
{
    int64_t va = (int32_t)a;
    int64_t vb = (uint32_t)b;
    int64_t vr = va + vb;
    if (vr > UINT32_MAX) {
        SET_QC();
        vr = UINT32_MAX;
    } else if (vr < 0) {
        SET_QC();
        vr = 0;
    }
    return vr;
}